

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

ssize_t __thiscall icu_63::VTimeZone::write(VTimeZone *this,int __fd,void *__buf,size_t __n)

{
  short sVar1;
  int8_t iVar2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  UnicodeString *in_RAX;
  UnicodeString *this_00;
  UnicodeString *extraout_RAX;
  UnicodeString *extraout_RAX_00;
  undefined4 srcLength;
  char16_t *pcVar6;
  uint uVar7;
  int iVar8;
  undefined4 in_register_00000034;
  VTZWriter *w;
  UVector *this_01;
  UnicodeString utcString;
  UVector customProps;
  UChar local_14a;
  UnicodeString local_148;
  UObject local_108;
  UnicodeString *local_100;
  undefined6 *local_f8;
  undefined1 *local_e8;
  undefined6 *local_d8;
  undefined1 *local_c8;
  undefined6 *local_b8;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  UVector local_58;
  
  w = (VTZWriter *)CONCAT44(in_register_00000034,__fd);
  this_01 = this->vtzlines;
  if (this_01 == (UVector *)0x0) {
    local_148.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
    local_148.fUnion.fStackFields.fLengthAndFlags = 2;
    UVector::UVector(&local_58,(UObjectDeleter *)0x0,uhash_compareUnicodeString_63,
                     (UErrorCode *)__buf);
    sVar1 = (this->olsonzid).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar8 = (this->olsonzid).fUnion.fFields.fLength;
    }
    else {
      iVar8 = (int)sVar1 >> 5;
    }
    if (0 < iVar8) {
      sVar1 = (this->icutzver).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (this->icutzver).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      if (0 < iVar5) {
        UnicodeString::doAppend(&local_148,&this->olsonzid,0,iVar8);
        local_14a = L'[';
        UnicodeString::doAppend(&local_148,&local_14a,0,1);
        sVar1 = (this->icutzver).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (this->icutzver).fUnion.fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        UnicodeString::doAppend(&local_148,&this->icutzver,0,iVar3);
        local_14a = L']';
        UnicodeString::doAppend(&local_148,&local_14a,0,1);
        UVector::addElement(&local_58,&local_148,(UErrorCode *)__buf);
      }
    }
    writeZone(this,w,this->tz,&local_58,(UErrorCode *)__buf);
    UVector::~UVector(&local_58);
    UnicodeString::~UnicodeString(&local_148);
    in_RAX = extraout_RAX_00;
  }
  else if (0 < this_01->count) {
    local_100 = &this->tzurl;
    iVar8 = 0;
    local_108._vptr_UObject = (_func_int **)&PTR__UnicodeString_003b2258;
    do {
      this_00 = (UnicodeString *)UVector::elementAt(this_01,iVar8);
      local_60 = ICAL_TZURL;
      iVar3 = u_strlen_63((UChar *)ICAL_TZURL);
      iVar2 = UnicodeString::doCompare(this_00,0,iVar3,(UChar *)ICAL_TZURL,0,iVar3);
      if (iVar2 == '\0') {
        uVar4 = u_strlen_63((UChar *)ICAL_TZURL);
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar7 = (this_00->fUnion).fFields.fLength;
        }
        else {
          uVar7 = (int)sVar1 >> 5;
        }
        if (uVar7 <= uVar4) {
          local_78 = ICAL_TZURL;
          goto LAB_00201c67;
        }
        if (((int)sVar1 & 2U) == 0) {
          pcVar6 = (this_00->fUnion).fFields.fArray;
        }
        else {
          pcVar6 = (char16_t *)((long)&this_00->fUnion + 2);
        }
        local_80 = ICAL_TZURL;
        if (pcVar6[(int)uVar4] != L':') goto LAB_00201c67;
        UnicodeString::doAppend(w->out,(UChar *)ICAL_TZURL,0,-1);
        local_e8 = ICAL_TZURL;
        local_148.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x3a;
        UnicodeString::doAppend(w->out,(UChar *)&local_148,0,1);
        sVar1 = (this->tzurl).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (this->tzurl).fUnion.fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        UnicodeString::doAppend(w->out,local_100,0,iVar3);
        in_RAX = UnicodeString::doAppend(w->out,L"\r\n",0,-1);
        local_f8 = &ICAL_NEWLINE;
      }
      else {
        local_68 = ICAL_TZURL;
LAB_00201c67:
        local_88 = ICAL_LASTMOD;
        iVar3 = u_strlen_63((UChar *)ICAL_LASTMOD);
        iVar2 = UnicodeString::doCompare(this_00,0,iVar3,(UChar *)ICAL_LASTMOD,0,iVar3);
        if (iVar2 == '\0') {
          uVar4 = u_strlen_63((UChar *)ICAL_LASTMOD);
          sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            uVar7 = (this_00->fUnion).fFields.fLength;
          }
          else {
            uVar7 = (int)sVar1 >> 5;
          }
          if (uVar4 < uVar7) {
            if (((int)sVar1 & 2U) == 0) {
              pcVar6 = (this_00->fUnion).fFields.fArray;
            }
            else {
              pcVar6 = (char16_t *)((long)&this_00->fUnion + 2);
            }
            local_a8 = ICAL_LASTMOD;
            if (pcVar6[(int)uVar4] == L':') {
              local_148.super_Replaceable.super_UObject._vptr_UObject =
                   (UObject)(UObject)local_108._vptr_UObject;
              local_148.fUnion.fStackFields.fLengthAndFlags = 2;
              UnicodeString::doAppend(w->out,(UChar *)ICAL_LASTMOD,0,-1);
              local_c8 = ICAL_LASTMOD;
              local_58.super_UObject._vptr_UObject._0_2_ = 0x3a;
              UnicodeString::doAppend(w->out,(UChar *)&local_58,0,1);
              getDateTimeString(this->lastmod,&local_148);
              local_58.super_UObject._vptr_UObject._0_2_ = 0x5a;
              UnicodeString::doAppend(&local_148,(UChar *)&local_58,0,1);
              srcLength = local_148.fUnion.fFields.fLength;
              if (-1 < local_148.fUnion.fStackFields.fLengthAndFlags) {
                srcLength = (int)local_148.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              UnicodeString::doAppend(w->out,&local_148,0,srcLength);
              UnicodeString::doAppend(w->out,L"\r\n",0,-1);
              local_d8 = &ICAL_NEWLINE;
              UnicodeString::~UnicodeString(&local_148);
              in_RAX = extraout_RAX;
              goto LAB_00201ddf;
            }
          }
          else {
            local_a0 = ICAL_LASTMOD;
          }
        }
        else {
          local_90 = ICAL_LASTMOD;
        }
        sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (this_00->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        UnicodeString::doAppend(w->out,this_00,0,iVar3);
        in_RAX = UnicodeString::doAppend(w->out,L"\r\n",0,-1);
        local_b8 = &ICAL_NEWLINE;
      }
LAB_00201ddf:
      iVar8 = iVar8 + 1;
      this_01 = this->vtzlines;
    } while (iVar8 < this_01->count);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void
VTimeZone::write(VTZWriter& writer, UErrorCode& status) const {
    if (vtzlines != NULL) {
        for (int32_t i = 0; i < vtzlines->size(); i++) {
            UnicodeString *line = (UnicodeString*)vtzlines->elementAt(i);
            if (line->startsWith(ICAL_TZURL, -1)
                && line->charAt(u_strlen(ICAL_TZURL)) == COLON) {
                writer.write(ICAL_TZURL);
                writer.write(COLON);
                writer.write(tzurl);
                writer.write(ICAL_NEWLINE);
            } else if (line->startsWith(ICAL_LASTMOD, -1)
                && line->charAt(u_strlen(ICAL_LASTMOD)) == COLON) {
                UnicodeString utcString;
                writer.write(ICAL_LASTMOD);
                writer.write(COLON);
                writer.write(getUTCDateTimeString(lastmod, utcString));
                writer.write(ICAL_NEWLINE);
            } else {
                writer.write(*line);
                writer.write(ICAL_NEWLINE);
            }
        }
    } else {
        UnicodeString icutzprop;
        UVector customProps(nullptr, uhash_compareUnicodeString, status);
        if (olsonzid.length() > 0 && icutzver.length() > 0) {
            icutzprop.append(olsonzid);
            icutzprop.append(u'[');
            icutzprop.append(icutzver);
            icutzprop.append(u']');
            customProps.addElement(&icutzprop, status);
        }
        writeZone(writer, *tz, &customProps, status);
    }
}